

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_rotation_y(mat4 *__return_storage_ptr__,float theta)

{
  float a;
  float c_00;
  float s;
  float c;
  float theta_local;
  
  a = cosf(theta);
  c_00 = sinf(theta);
  mat4_create(__return_storage_ptr__,a,0.0,c_00,0.0,0.0,1.0,0.0,0.0,-c_00,0.0,a,0.0,0.0,0.0,0.0,1.0)
  ;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_rotation_y(float theta) {
    float c = cosf(theta);
    float s = sinf(theta);
    return mat4_create(
            c, 0.0f, s, 0.0f,
            0.0f, 1.0f, 0.0f, 0.0f,
            -s, 0.0f, c, 0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
}